

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int parse_int(char *val_str,int64_t min,int64_t max,int base,int64_t *ret,lyd_node *node)

{
  int *piVar1;
  lys_node *plVar2;
  ushort **ppuVar3;
  char *local_60;
  char *local_48;
  char *strptr;
  lyd_node *node_local;
  int64_t *ret_local;
  int64_t iStack_28;
  int base_local;
  int64_t max_local;
  int64_t min_local;
  char *val_str_local;
  
  strptr = (char *)node;
  node_local = (lyd_node *)ret;
  ret_local._4_4_ = base;
  iStack_28 = max;
  max_local = min;
  min_local = (int64_t)val_str;
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x1b0,
                  "int parse_int(const char *, int64_t, int64_t, int, int64_t *, struct lyd_node *)"
                 );
  }
  if ((val_str != (char *)0x0) && (*val_str != '\0')) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    local_48 = (char *)0x0;
    plVar2 = (lys_node *)strtoll((char *)min_local,&local_48,ret_local._4_4_);
    node_local->schema = plVar2;
    piVar1 = __errno_location();
    if ((*piVar1 == 0) &&
       ((max_local <= (long)node_local->schema && ((long)node_local->schema <= iStack_28)))) {
      if ((local_48 != (char *)0x0) && (*local_48 != '\0')) {
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*local_48] & 0x2000) != 0) {
          local_48 = local_48 + 1;
        }
        if (*local_48 != '\0') goto LAB_001360aa;
      }
      return 0;
    }
  }
LAB_001360aa:
  if (min_local == 0) {
    local_60 = "";
  }
  else {
    local_60 = (char *)min_local;
  }
  ly_vlog((ly_ctx *)**(undefined8 **)(*(long *)strptr + 0x30),LYE_INVAL,LY_VLOG_LYD,strptr,local_60,
          **(undefined8 **)strptr);
  return 1;
}

Assistant:

static int
parse_int(const char *val_str, int64_t min, int64_t max, int base, int64_t *ret, struct lyd_node *node)
{
    char *strptr;

    assert(node);

    if (!val_str || !val_str[0]) {
        goto error;
    }

    /* convert to 64-bit integer, all the redundant characters are handled */
    errno = 0;
    strptr = NULL;

    /* parse the value */
    *ret = strtoll(val_str, &strptr, base);
    if (errno || (*ret < min) || (*ret > max)) {
        goto error;
    } else if (strptr && *strptr) {
        while (isspace(*strptr)) {
            ++strptr;
        }
        if (*strptr) {
            goto error;
        }
    }

    return EXIT_SUCCESS;

error:
    LOGVAL(node->schema->module->ctx, LYE_INVAL, LY_VLOG_LYD, node, val_str ? val_str : "", node->schema->name);
    return EXIT_FAILURE;
}